

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

bool jsonip::parser::
     or_<jsonip::parser::char_<(char)32>,jsonip::parser::char_<(char)9>,jsonip::parser::new_line,jsonip::parser::char_<(char)13>,jsonip::grammar::comment_,jsonip::grammar::ccomment_,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
     ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  pointer *ppSVar1;
  char *pcVar2;
  iterator iVar3;
  Reader *pRVar4;
  PositionType pcVar5;
  size_t sVar6;
  bool bVar7;
  bool bVar8;
  pointer pSVar9;
  PositionType p;
  char *pcVar10;
  undefined1 auStack_20 [8];
  State cur_state;
  
  auStack_20 = (undefined1  [8])state->reader_->pos_;
  cur_state.pos_ = (PositionType)state->line_;
  iVar3._M_current =
       (state->stack_).
       super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (state->stack_).
      super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
    ::
    _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
              ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                *)&state->stack_,iVar3,(State *)auStack_20);
  }
  else {
    (iVar3._M_current)->pos_ = (PositionType)auStack_20;
    (iVar3._M_current)->line_ = (size_t)cur_state.pos_;
    ppSVar1 = &(state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  pRVar4 = state->reader_;
  pcVar5 = pRVar4->buf_;
  pcVar10 = pRVar4->pos_;
  sVar6 = pRVar4->len_;
  if ((((long)pcVar10 - (long)pcVar5 == sVar6) || (*pcVar10 != ' ')) &&
     ((pcVar10 = pRVar4->pos_, (long)pcVar10 - (long)pcVar5 == sVar6 || (*pcVar10 != '\t')))) {
    pcVar10 = pRVar4->pos_;
    if (((long)pcVar10 - (long)pcVar5 == sVar6) || (*pcVar10 != '\n')) {
      pcVar10 = pRVar4->pos_;
      if (((long)pcVar10 - (long)pcVar5 != sVar6) && (*pcVar10 == '\r')) goto LAB_00108ff7;
      bVar7 = seq_<jsonip::parser::char_<(char)47>,jsonip::parser::char_<(char)47>,jsonip::parser::apply_until_<jsonip::parser::notchar_<(char)10>,jsonip::parser::new_line>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
              ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                        (state);
      bVar8 = true;
      if (bVar7) goto LAB_00109000;
      auStack_20 = (undefined1  [8])state->reader_->pos_;
      cur_state.pos_ = (PositionType)state->line_;
      iVar3._M_current =
           (state->stack_).
           super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (state->stack_).
          super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
        ::
        _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
                  ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                    *)&state->stack_,iVar3,(State *)auStack_20);
      }
      else {
        (iVar3._M_current)->pos_ = (PositionType)auStack_20;
        (iVar3._M_current)->line_ = (size_t)cur_state.pos_;
        ppSVar1 = &(state->stack_).
                   super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      pRVar4 = state->reader_;
      pcVar10 = pRVar4->pos_;
      if (((long)pcVar10 - (long)pRVar4->buf_ == pRVar4->len_) || (*pcVar10 != '/')) {
LAB_001090e1:
        bVar8 = false;
      }
      else {
        pcVar2 = pcVar10 + 1;
        pRVar4->pos_ = pcVar2;
        if (((long)pcVar2 - (long)pRVar4->buf_ == pRVar4->len_) || (*pcVar2 != '*'))
        goto LAB_001090e1;
        pRVar4->pos_ = pcVar10 + 2;
        bVar8 = apply_until_<jsonip::parser::or_<jsonip::parser::new_line,jsonip::parser::notchar_<(char)10>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>>,jsonip::grammar::ccomment_end>
                ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                          (state);
      }
      pcVar5 = state->reader_->pos_;
      if (bVar8 == false) {
        if (state->max_pos_ < pcVar5) {
          state->max_pos_ = pcVar5;
        }
        state->reader_->pos_ =
             (state->stack_).
             super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].pos_;
        pSVar9 = (state->stack_).
                 super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        state->line_ = pSVar9[-1].line_;
      }
      else {
        if (state->max_pos_ < pcVar5) {
          state->max_pos_ = pcVar5;
        }
        pSVar9 = (state->stack_).
                 super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      (state->stack_).
      super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar9 + -1;
      goto LAB_00109000;
    }
    pRVar4->pos_ = pcVar10 + 1;
    state->line_ = state->line_ + 1;
  }
  else {
LAB_00108ff7:
    pRVar4->pos_ = pcVar10 + 1;
  }
  bVar8 = true;
LAB_00109000:
  pcVar5 = state->reader_->pos_;
  if (bVar8 == false) {
    if (state->max_pos_ < pcVar5) {
      state->max_pos_ = pcVar5;
    }
    state->reader_->pos_ =
         (state->stack_).
         super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].pos_;
    pSVar9 = (state->stack_).
             super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    state->line_ = pSVar9[-1].line_;
  }
  else {
    if (state->max_pos_ < pcVar5) {
      state->max_pos_ = pcVar5;
    }
    pSVar9 = (state->stack_).
             super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  (state->stack_).
  super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar9 + -1;
  return bVar8;
}

Assistant:

static inline bool match(S& state)
        {
            state.push_state();

            bool var = C0::match(state) || C1::match(state) ||
                       C2::match(state) || C3::match(state) ||
                       C4::match(state) || C5::match(state) ||
                       C6::match(state) || C7::match(state);

            var ? state.commit() : state.rollback();

            return var;
        }